

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

YV12_BUFFER_CONFIG * av1_get_scaled_ref_frame(AV1_COMP *cpi,int ref_frame)

{
  RefCntBuffer *pRVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  int iVar3;
  RefCntBuffer *pRVar4;
  
  iVar3 = -1;
  if ((byte)((char)ref_frame - 1U) < 8) {
    iVar3 = (cpi->common).remapped_ref_idx[(ref_frame & 0xffU) - 1];
  }
  pRVar1 = cpi->scaled_ref_buf[(long)ref_frame + -1];
  if (iVar3 == -1) {
    pRVar4 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar4 = (cpi->common).ref_frame_map[iVar3];
  }
  pYVar2 = (YV12_BUFFER_CONFIG *)0x0;
  if (pRVar1 != pRVar4) {
    pYVar2 = &pRVar1->buf;
  }
  if (pRVar1 == (RefCntBuffer *)0x0) {
    pYVar2 = (YV12_BUFFER_CONFIG *)0x0;
  }
  return pYVar2;
}

Assistant:

YV12_BUFFER_CONFIG *av1_get_scaled_ref_frame(const AV1_COMP *cpi,
                                             int ref_frame) {
  assert(ref_frame >= LAST_FRAME && ref_frame <= ALTREF_FRAME);
  RefCntBuffer *const scaled_buf = cpi->scaled_ref_buf[ref_frame - 1];
  const RefCntBuffer *const ref_buf =
      get_ref_frame_buf(&cpi->common, ref_frame);
  return (scaled_buf != ref_buf && scaled_buf != NULL) ? &scaled_buf->buf
                                                       : NULL;
}